

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_property(nk_context *ctx,char *name,nk_property_variant *variant,float inc_per_pixel,
                nk_property_filter filter)

{
  nk_style_item_data *img;
  nk_flags *state;
  nk_vec2 nVar1;
  nk_property nVar2;
  char cVar3;
  byte bVar4;
  nk_hash seed;
  nk_property_kind nVar5;
  nk_panel *pnVar6;
  nk_user_font *pnVar7;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var8;
  double dVar9;
  double dVar10;
  nk_plugin_paste p_Var11;
  undefined8 uVar12;
  int *piVar13;
  undefined1 auVar14 [16];
  int *piVar15;
  int *piVar16;
  nk_button_behavior behavior;
  nk_widget_layout_states nVar17;
  int iVar18;
  nk_bool nVar19;
  nk_bool nVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  nk_style_property *pnVar24;
  byte *pbVar25;
  ulong uVar26;
  ulong uVar27;
  nk_color c;
  nk_context *pnVar28;
  nk_context *in;
  char *pcVar29;
  nk_command_buffer *pnVar30;
  uint uVar31;
  int *piVar32;
  uint uVar33;
  nk_window *pnVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  float fVar40;
  nk_rect r;
  nk_rect b;
  nk_rect b_00;
  nk_rect b_01;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect r_00;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect b_02;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect bounds_02;
  int *local_268;
  char *local_260;
  int num_len;
  undefined8 local_248;
  float fStack_240;
  float fStack_23c;
  int *local_230;
  nk_context *local_228;
  char *local_220;
  nk_rect local_218;
  float local_208;
  float fStack_204;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  int *local_1e0;
  int *local_1d8;
  int *local_1d0;
  nk_user_font *local_1c8;
  nk_command_buffer *local_1c0;
  nk_hash local_1b4;
  int local_1b0;
  float local_1ac;
  int local_1a8;
  nk_button_behavior local_1a4;
  nk_property_filter local_1a0;
  int dummy_select_end;
  int dummy_select_begin;
  int dummy_cursor;
  int dummy_length;
  int dummy_state;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  float fStack_170;
  float fStack_16c;
  int *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  nk_text local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  undefined4 uStack_e0;
  float fStack_dc;
  nk_rect bounds;
  byte local_c8 [64];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  char dummy_buffer [64];
  
  dummy_state = 0;
  dummy_length = 0;
  dummy_cursor = 0;
  local_1c0 = (nk_command_buffer *)CONCAT44(local_1c0._4_4_,inc_per_pixel);
  dummy_select_begin = 0;
  dummy_select_end = 0;
  pnVar34 = ctx->current;
  if (pnVar34 == (nk_window *)0x0) {
    return;
  }
  pnVar6 = pnVar34->layout;
  if (pnVar6 == (nk_panel *)0x0) {
    return;
  }
  nVar17 = nk_widget(&bounds,ctx);
  if (nVar17 == NK_WIDGET_INVALID) {
    return;
  }
  cVar3 = *name;
  local_1a0 = filter;
  iVar18 = nk_strlen(name);
  if (cVar3 == '#') {
    seed = (pnVar34->property).seq;
    (pnVar34->property).seq = seed + 1;
    local_1b4 = nk_murmur_hash(name,iVar18,seed);
    name = name + 1;
  }
  else {
    local_1b4 = nk_murmur_hash(name,iVar18,0x2a);
  }
  local_1d0 = &dummy_select_end;
  local_1d8 = &dummy_select_begin;
  piVar32 = &dummy_cursor;
  local_230 = &dummy_length;
  local_260 = dummy_buffer;
  local_268 = &dummy_state;
  iVar18 = 0;
  if (((pnVar34->property).active != 0) && (iVar18 = 0, local_1b4 == (pnVar34->property).name)) {
    local_260 = (pnVar34->property).buffer;
    local_230 = &(pnVar34->property).length;
    piVar32 = &(pnVar34->property).cursor;
    local_268 = &(pnVar34->property).state;
    local_1d8 = &(pnVar34->property).select_start;
    local_1d0 = &(pnVar34->property).select_end;
    iVar18 = (pnVar34->property).state;
  }
  (ctx->text_edit).clip.copy = (ctx->clip).copy;
  p_Var11 = (ctx->clip).paste;
  (ctx->text_edit).clip.userdata = (ctx->clip).userdata;
  (ctx->text_edit).clip.paste = p_Var11;
  if ((nVar17 == NK_WIDGET_ROM) && ((pnVar34->property).active == 0)) {
    pnVar28 = (nk_context *)0x0;
  }
  else {
    pnVar28 = (nk_context *)0x0;
    if ((pnVar6->flags & 0x1000) == 0) {
      pnVar28 = ctx;
    }
  }
  pnVar7 = (ctx->style).font;
  local_1a4 = ctx->button_behavior;
  local_148 = bounds.y;
  fStack_240 = bounds.h;
  local_208 = bounds.w;
  fStack_204 = bounds.h;
  uStack_200 = 0;
  local_218.x = bounds.x;
  local_218.y = bounds.y;
  local_218.w = 0.0;
  local_218.h = 0.0;
  fVar37 = pnVar7->height;
  local_1f8 = ZEXT416((uint)(fVar37 * 0.5));
  local_1ac = (ctx->style).property.border;
  local_138._0_4_ = bounds.x + local_1ac + (ctx->style).property.padding.x;
  uStack_130 = 0;
  fStack_23c = fStack_240;
  fStack_144 = local_148;
  fStack_140 = local_148;
  fStack_13c = local_148;
  local_138._4_4_ = local_148;
  local_248._0_4_ = fStack_240;
  local_248._4_4_ = fStack_240;
  local_1a8 = nk_strlen(name);
  pcVar29 = name;
  fVar35 = (*pnVar7->width)(pnVar7->userdata,fVar37,name,local_1a8);
  piVar13 = local_230;
  iVar21 = (int)pcVar29;
  fVar37 = (ctx->style).property.border;
  nVar1 = (ctx->style).property.padding;
  fVar36 = nVar1.x;
  fVar40 = nVar1.y;
  local_118 = (float)local_138 + (float)local_1f8._0_4_ + fVar36;
  fStack_114 = fVar37 + local_218.y + fVar40;
  fStack_110 = local_138._4_4_ + local_218.w + 0.0;
  fStack_10c = local_218.h + 0.0 + 0.0;
  local_158 = CONCAT44(fVar40,fVar36 + fVar36 + fVar35);
  uStack_150 = 0;
  local_178 = (nk_window *)
              CONCAT44(local_248._4_4_,(float)local_248 - (fVar37 + fVar37 + fVar40 + fVar40));
  fStack_170 = fStack_240;
  fStack_16c = fStack_23c;
  local_188 = (local_218.x + local_208) - ((float)local_1f8._0_4_ + fVar36);
  fStack_184 = local_218.y;
  fStack_180 = local_218.w;
  fStack_17c = local_218.h;
  local_228 = pnVar28;
  local_1c8 = pnVar7;
  if (*local_268 == 1) {
    local_e8 = (*pnVar7->width)(pnVar7->userdata,pnVar7->height,local_260,*local_230);
    local_e8 = local_e8 + (ctx->style).property.edit.cursor_size;
    local_220 = local_260;
    local_160 = piVar13;
    pnVar28 = local_228;
  }
  else {
    if (variant->kind == NK_PROPERTY_DOUBLE) {
      dVar9 = (variant->value).d;
LAB_0012190b:
      nk_dtoa((char *)local_c8,dVar9);
      num_len = nk_string_float_limit((char *)local_c8,iVar21);
    }
    else {
      if (variant->kind == NK_PROPERTY_FLOAT) {
        dVar9 = (double)(variant->value).f;
        goto LAB_0012190b;
      }
      iVar21 = (variant->value).i;
      uVar23 = (ulong)iVar21;
      if (uVar23 == 0) {
        local_c8[0] = 0x30;
        local_c8[1] = 0;
      }
      else {
        if (iVar21 < 0) {
          local_c8[0] = 0x2d;
          uVar23 = -uVar23;
        }
        pbVar25 = local_c8 + (iVar21 < 0);
        for (; 0 < (long)uVar23; uVar23 = uVar23 / 10) {
          *pbVar25 = (byte)(uVar23 % 10) | 0x30;
          pbVar25 = pbVar25 + 1;
        }
        *pbVar25 = 0;
        pbVar25 = local_c8 + (local_c8[0] == 0x2d);
        uVar31 = nk_strlen((char *)pbVar25);
        uVar26 = (ulong)uVar31;
        uVar27 = 0;
        uVar23 = (long)(int)uVar31 / 2 & 0xffffffff;
        if ((int)((long)(int)uVar31 / 2) < 1) {
          uVar23 = uVar27;
        }
        for (; uVar23 != uVar27; uVar27 = uVar27 + 1) {
          bVar4 = pbVar25[uVar27];
          uVar26 = (ulong)((int)uVar26 + -1);
          pbVar25[uVar27] = pbVar25[uVar26];
          pbVar25[uVar26] = bVar4;
        }
      }
      num_len = nk_strlen((char *)local_c8);
    }
    local_220 = (char *)local_c8;
    local_e8 = (*local_1c8->width)(local_1c8->userdata,local_1c8->height,local_220,num_len);
    local_160 = &num_len;
  }
  state = &ctx->last_widget_state;
  fVar37 = (ctx->style).property.border;
  fVar35 = (ctx->style).property.padding.x;
  local_e8 = fVar35 + fVar35 + local_e8;
  uVar12 = CONCAT44((undefined4)local_178,(float)local_158);
  uStack_150 = CONCAT44(local_178._4_4_,local_158._4_4_);
  fVar36 = local_188 - (local_118 + (float)local_158);
  if (fVar36 <= local_e8) {
    local_e8 = fVar36;
  }
  local_f8 = local_188 - (fVar35 + local_e8);
  fStack_f4 = local_148 + fVar37;
  fStack_f0 = fStack_184;
  fStack_ec = fStack_144;
  fStack_e4 = (float)local_248 - (fVar37 + fVar37);
  uStack_e0 = 0;
  fStack_dc = local_248._4_4_;
  local_1b0 = *local_268;
  local_1e0 = piVar32;
  local_178 = pnVar34;
  local_158 = uVar12;
  if (pnVar28 == (nk_context *)0x0) {
    if (local_1b0 == 2) {
      uVar31 = *state & 2 | 4;
      *state = uVar31;
      pnVar28 = (nk_context *)0x0;
LAB_00121c0e:
      pnVar34 = local_178;
      if (((uVar31 & 0x10) == 0) ||
         (rect_00.w = local_208, rect_00.h = fStack_204, rect_00.x = local_218.x,
         rect_00.y = local_218.y,
         nVar19 = nk_input_is_mouse_prev_hovering_rect(&pnVar28->input,rect_00), nVar19 != 0))
      goto LAB_00121d15;
      uVar31 = uVar31 | 8;
LAB_00121d33:
      *state = uVar31;
      goto LAB_00121d3b;
    }
  }
  else {
    if (local_1b0 == 2) {
LAB_00121b29:
      local_128 = (float)(pnVar28->input).mouse.buttons[0].down;
      b_01.w = local_208;
      b_01.h = fStack_204;
      b_01.x = local_218.x;
      b_01.y = local_218.y;
      nVar19 = nk_input_has_mouse_click_down_in_rect(&pnVar28->input,NK_BUTTON_LEFT,b_01,1);
      uVar33 = *state & 2 | 4;
      *state = uVar33;
      rect.w = local_208;
      rect.h = fStack_204;
      rect.x = local_218.x;
      rect.y = local_218.y;
      nVar20 = nk_input_is_mouse_hovering_rect(&pnVar28->input,rect);
      uVar31 = 0x12;
      if (nVar20 == 0) {
        uVar31 = uVar33;
      }
      *state = uVar31;
      pnVar28 = local_228;
      if ((local_128 == 0.0) || (nVar19 == 0)) goto LAB_00121c0e;
      fVar37 = local_1c0._0_4_ * (local_228->input).mouse.delta.x;
      nVar5 = variant->kind;
      if (nVar5 == NK_PROPERTY_DOUBLE) {
        dVar9 = (double)fVar37 + (variant->value).d;
        if ((variant->max_value).d <= dVar9) {
          dVar9 = (variant->max_value).d;
        }
        dVar10 = (variant->min_value).d;
        if ((variant->min_value).d <= dVar9) {
          dVar10 = dVar9;
        }
        (variant->value).d = dVar10;
      }
      else if (nVar5 == NK_PROPERTY_FLOAT) {
        fVar37 = fVar37 + (variant->value).f;
        if ((variant->max_value).f <= fVar37) {
          fVar37 = (variant->max_value).f;
        }
        fVar35 = (variant->min_value).f;
        if ((variant->min_value).f <= fVar37) {
          fVar35 = fVar37;
        }
        (variant->value).f = fVar35;
      }
      else if (nVar5 == NK_PROPERTY_INT) {
        iVar21 = (int)fVar37 + (variant->value).i;
        if ((variant->max_value).i <= iVar21) {
          iVar21 = (variant->max_value).i;
        }
        if (iVar21 <= (variant->min_value).i) {
          iVar21 = (variant->min_value).i;
        }
        (variant->value).i = iVar21;
      }
      *state = 0x22;
      uVar31 = 0x22;
      pnVar34 = local_178;
LAB_00121d15:
      rect_01.w = local_208;
      rect_01.h = fStack_204;
      rect_01.x = local_218.x;
      rect_01.y = local_218.y;
      nVar19 = nk_input_is_mouse_prev_hovering_rect(&pnVar28->input,rect_01);
      if (nVar19 != 0) {
        uVar31 = uVar31 | 0x40;
        goto LAB_00121d33;
      }
LAB_00121d3b:
      iVar21 = 0;
      if ((uVar31 & 0x20) != 0) goto LAB_00121d4a;
    }
    else {
      if (local_1b0 != 0) goto LAB_00121d4a;
      fStack_84 = fStack_184;
      fStack_80 = fStack_180;
      fStack_7c = fStack_17c;
      fStack_124 = fStack_114;
      fStack_120 = fStack_110;
      fStack_11c = fStack_10c;
      r.y = fStack_f4;
      r.x = local_f8;
      r.h = fStack_e4;
      r.w = local_e8;
      local_128 = local_118 + (float)local_158;
      local_88 = local_f8;
      nVar19 = nk_button_behavior(state,r,&pnVar28->input,NK_BUTTON_DEFAULT);
      if (nVar19 == 0) {
        b.y = fStack_114;
        b.x = local_118;
        b.w = (float)local_158;
        b.h = (float)local_158._4_4_;
        nVar19 = nk_input_is_mouse_click_down_in_rect(&pnVar28->input,NK_BUTTON_LEFT,b,1);
        if (nVar19 == 0) {
          b_00.y = local_218.y;
          b_00.x = local_128;
          b_00.h = fStack_204;
          b_00.w = local_88 - local_128;
          nVar19 = nk_input_is_mouse_click_down_in_rect(&pnVar28->input,NK_BUTTON_LEFT,b_00,1);
          if (nVar19 == 0) {
            if (*local_268 == 2) goto LAB_00121b29;
            goto LAB_00121d4a;
          }
        }
        *local_268 = 2;
        goto LAB_00121b29;
      }
      iVar21 = 1;
    }
    *local_268 = iVar21;
  }
LAB_00121d4a:
  local_148 = local_148 + local_1ac;
  local_248._0_4_ = (float)local_248 * 0.5;
  pnVar30 = &pnVar34->buffer;
  p_Var8 = (ctx->style).property.draw_begin;
  if (p_Var8 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var8)(pnVar30,(nk_handle)(ctx->style).property.userdata.ptr);
  }
  if ((*state & 0x20) == 0) {
    if ((*state & 0x10) == 0) {
      pnVar24 = &(ctx->style).property;
      local_108.text = (ctx->style).property.label_normal;
    }
    else {
      pnVar24 = (nk_style_property *)&(ctx->style).property.hover;
      local_108.text = (ctx->style).property.label_hover;
    }
  }
  else {
    pnVar24 = (nk_style_property *)&(ctx->style).property.active;
    local_108.text = (ctx->style).property.label_active;
  }
  local_248 = (nk_text_edit *)
              CONCAT44(local_248._4_4_,((float)local_248 + local_148) - (float)local_1f8._0_4_ * 0.5
                      );
  img = &(pnVar24->normal).data;
  if ((pnVar24->normal).type == NK_STYLE_ITEM_IMAGE) {
    r_00.w = local_208;
    r_00.h = fStack_204;
    r_00.x = local_218.x;
    r_00.y = local_218.y;
    nk_draw_image(pnVar30,r_00,&img->image,(nk_color)0xffffffff);
    c.r = '\0';
    c.g = '\0';
    c.b = '\0';
    c.a = '\0';
  }
  else {
    c = img->color;
    rect_02.w = local_208;
    rect_02.h = fStack_204;
    rect_02.x = local_218.x;
    rect_02.y = local_218.y;
    nk_fill_rect(pnVar30,rect_02,(ctx->style).property.rounding,c);
    rect_03.w = local_208;
    rect_03.h = fStack_204;
    rect_03.x = local_218.x;
    rect_03.y = local_218.y;
    nk_stroke_rect(pnVar30,rect_03,(ctx->style).property.rounding,(ctx->style).property.border,
                   img->color);
  }
  fVar37 = local_138._4_4_;
  pnVar7 = local_1c8;
  local_1f8._4_4_ = local_1f8._0_4_;
  local_1f8._8_4_ = local_1f8._0_4_;
  local_1f8._12_4_ = local_1f8._0_4_;
  local_138 = CONCAT44((float)local_248,(float)local_138);
  uStack_130 = CONCAT44(local_248._4_4_,fVar37);
  local_108.padding.x = 0.0;
  local_108.padding.y = 0.0;
  b_02.y = fStack_114;
  b_02.x = local_118;
  b_02.w = (float)local_158;
  b_02.h = (float)local_158._4_4_;
  local_108.background = c;
  nk_widget_text(pnVar30,b_02,name,local_1a8,&local_108,0x12,local_1c8);
  p_Var8 = (ctx->style).property.draw_end;
  if (p_Var8 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var8)(pnVar30,(nk_handle)(ctx->style).property.userdata.ptr);
  }
  fStack_180 = fStack_184;
  behavior = local_1a4;
  auVar14 = local_1f8;
  pnVar28 = local_228;
  fStack_184 = (float)local_248;
  fStack_17c = local_248._4_4_;
  bounds_00.w = (float)local_1f8._0_4_;
  bounds_00.h = (float)local_1f8._4_4_;
  bounds_00.x = (float)local_138;
  bounds_00.y = local_138._4_4_;
  local_1f8 = auVar14;
  nVar19 = nk_do_button_symbol(state,pnVar30,bounds_00,(ctx->style).property.sym_left,local_1a4,
                               &(ctx->style).property.dec_button,&local_228->input,pnVar7);
  auVar14 = local_1f8;
  if (nVar19 != 0) {
    nVar5 = variant->kind;
    if (nVar5 == NK_PROPERTY_DOUBLE) {
      dVar9 = (variant->value).d - (variant->step).d;
      if ((variant->max_value).d <= dVar9) {
        dVar9 = (variant->max_value).d;
      }
      dVar10 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar9) {
        dVar10 = dVar9;
      }
      (variant->value).d = dVar10;
    }
    else if (nVar5 == NK_PROPERTY_FLOAT) {
      fVar37 = (variant->value).f - (variant->step).f;
      if ((variant->max_value).f <= fVar37) {
        fVar37 = (variant->max_value).f;
      }
      fVar35 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar37) {
        fVar35 = fVar37;
      }
      (variant->value).f = fVar35;
    }
    else if (nVar5 == NK_PROPERTY_INT) {
      iVar21 = (variant->value).i - (variant->step).i;
      if ((variant->max_value).i <= iVar21) {
        iVar21 = (variant->max_value).i;
      }
      if (iVar21 <= (variant->min_value).i) {
        iVar21 = (variant->min_value).i;
      }
      (variant->value).i = iVar21;
    }
  }
  bounds_01.y = fStack_184;
  bounds_01.x = local_188;
  bounds_01.w = (float)local_1f8._0_4_;
  bounds_01.h = (float)local_1f8._4_4_;
  local_1f8 = auVar14;
  nVar19 = nk_do_button_symbol(state,pnVar30,bounds_01,(ctx->style).property.sym_right,behavior,
                               &(ctx->style).property.inc_button,&pnVar28->input,pnVar7);
  piVar32 = local_160;
  if (nVar19 != 0) {
    nVar5 = variant->kind;
    if (nVar5 == NK_PROPERTY_DOUBLE) {
      dVar9 = (variant->value).d + (variant->step).d;
      if ((variant->max_value).d <= dVar9) {
        dVar9 = (variant->max_value).d;
      }
      dVar10 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar9) {
        dVar10 = dVar9;
      }
      (variant->value).d = dVar10;
    }
    else if (nVar5 == NK_PROPERTY_FLOAT) {
      fVar37 = (variant->value).f + (variant->step).f;
      if ((variant->max_value).f <= fVar37) {
        fVar37 = (variant->max_value).f;
      }
      fVar35 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar37) {
        fVar35 = fVar37;
      }
      (variant->value).f = fVar35;
    }
    else if (nVar5 == NK_PROPERTY_INT) {
      iVar21 = (variant->step).i + (variant->value).i;
      if ((variant->max_value).i <= iVar21) {
        iVar21 = (variant->max_value).i;
      }
      if (iVar21 <= (variant->min_value).i) {
        iVar21 = (variant->min_value).i;
      }
      (variant->value).i = iVar21;
    }
  }
  local_1c0 = pnVar30;
  if (*local_268 == 1 && local_1b0 != 1) {
    nk_memcopy(local_260,local_220,(long)*local_160);
    iVar21 = nk_utf_len(local_260,*piVar32);
    *local_1e0 = iVar21;
    *local_230 = *piVar32;
    local_220 = local_260;
    uVar31 = 0;
    piVar32 = local_230;
  }
  else {
    uVar31 = (uint)(*local_268 == 1);
  }
  piVar13 = local_1e0;
  local_1f8._0_8_ = (&PTR_nk_filter_decimal_0018e4a0)[local_1a0];
  local_248 = &ctx->text_edit;
  nk_textedit_clear_state
            (&ctx->text_edit,NK_TEXT_EDIT_SINGLE_LINE,
             (nk_plugin_filter)(&PTR_nk_filter_decimal_0018e4a0)[local_1a0]);
  piVar16 = local_1d0;
  piVar15 = local_1d8;
  pnVar28 = local_228;
  (ctx->text_edit).active = (uchar)uVar31;
  iVar21 = *piVar32;
  (ctx->text_edit).string.len = iVar21;
  iVar22 = *piVar13;
  if (iVar22 < iVar21) {
    iVar21 = iVar22;
  }
  iVar22 = 0;
  if (iVar21 < 1) {
    iVar21 = iVar22;
  }
  (ctx->text_edit).cursor = iVar21;
  iVar21 = *piVar32;
  if (*local_1d8 < *piVar32) {
    iVar21 = *local_1d8;
  }
  if (iVar21 < 1) {
    iVar21 = iVar22;
  }
  (ctx->text_edit).select_start = iVar21;
  iVar21 = *piVar32;
  if (*local_1d0 < *piVar32) {
    iVar21 = *local_1d0;
  }
  if (iVar21 < 1) {
    iVar21 = iVar22;
  }
  (ctx->text_edit).select_end = iVar21;
  (ctx->text_edit).string.buffer.allocated = (long)*piVar32;
  (ctx->text_edit).string.buffer.memory.size = 0x40;
  (ctx->text_edit).string.buffer.memory.ptr = local_220;
  (ctx->text_edit).string.buffer.size = 0x40;
  (ctx->text_edit).mode = '\x01';
  in = (nk_context *)0x0;
  if (*local_268 == 1) {
    in = local_228;
  }
  bounds_02.y = fStack_f4;
  bounds_02.x = local_f8;
  bounds_02.h = fStack_e4;
  bounds_02.w = local_e8;
  pnVar30 = local_1c0;
  local_188 = (float)uVar31;
  nk_do_edit(state,local_1c0,bounds_02,0x262,(nk_plugin_filter)local_1f8._0_8_,local_248,
             &(ctx->style).property.edit,&in->input,local_1c8);
  iVar21 = (int)pnVar30;
  *piVar32 = (ctx->text_edit).string.len;
  *piVar13 = (ctx->text_edit).cursor;
  *piVar15 = (ctx->text_edit).select_start;
  *piVar16 = (ctx->text_edit).select_end;
  pnVar34 = local_178;
  if ((ctx->text_edit).active != '\0') {
    iVar21 = 4;
    nVar19 = nk_input_is_key_pressed(&pnVar28->input,NK_KEY_ENTER);
    if (nVar19 == 0) goto LAB_0012235d;
    (ctx->text_edit).active = '\0';
  }
  if (local_188 != 0.0) {
    *local_268 = 0;
    local_260[*local_230] = 0;
    nVar5 = variant->kind;
    if (nVar5 == NK_PROPERTY_DOUBLE) {
      nk_string_float_limit(local_260,iVar21);
      dVar9 = nk_strtod(local_260,(char **)0x0);
      iVar21 = SUB84(dVar9,0);
      uVar38 = (undefined4)((ulong)dVar9 >> 0x20);
      nVar2 = variant->max_value;
      if (nVar2.d <= dVar9) {
        iVar21 = nVar2.i;
        uVar38 = nVar2._4_4_;
      }
      nVar2 = variant->min_value;
      iVar22 = nVar2.i;
      uVar39 = nVar2._4_4_;
      if (nVar2.d <= (double)CONCAT44(uVar38,iVar21)) {
        iVar22 = iVar21;
        uVar39 = uVar38;
      }
      nVar2._4_4_ = uVar39;
      nVar2.i = iVar22;
      variant->value = nVar2;
    }
    else if (nVar5 == NK_PROPERTY_FLOAT) {
      nk_string_float_limit(local_260,iVar21);
      fVar37 = nk_strtof(local_260,(char **)0x0);
      if ((variant->max_value).f <= fVar37) {
        fVar37 = (variant->max_value).f;
      }
      fVar35 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar37) {
        fVar35 = fVar37;
      }
      (variant->value).f = fVar35;
    }
    else if (nVar5 == NK_PROPERTY_INT) {
      iVar22 = nk_strtoi(local_260,(char **)0x0);
      iVar21 = (variant->max_value).i;
      if (iVar22 < (variant->max_value).i) {
        iVar21 = iVar22;
      }
      if (iVar21 <= (variant->min_value).i) {
        iVar21 = (variant->min_value).i;
      }
      (variant->value).i = iVar21;
    }
  }
LAB_0012235d:
  piVar32 = local_230;
  iVar21 = *local_268;
  if (pnVar28 != (nk_context *)0x0) {
    if (iVar21 == 0) {
      iVar21 = 0;
    }
    else {
      if ((pnVar34->property).active != 0) {
        return;
      }
      (pnVar34->property).active = 1;
      nk_memcopy((pnVar34->property).buffer,local_260,(long)*local_230);
      (pnVar34->property).length = *piVar32;
      (pnVar34->property).cursor = *local_1e0;
      iVar21 = *local_268;
      (pnVar34->property).state = iVar21;
      (pnVar34->property).name = local_1b4;
      (pnVar34->property).select_start = *local_1d8;
      (pnVar34->property).select_end = *local_1d0;
      if (iVar21 == 2) {
        (ctx->input).mouse.grab = '\x01';
        (ctx->input).mouse.grabbed = '\x01';
        return;
      }
    }
  }
  if (iVar18 != 0 && iVar21 == 0) {
    if (iVar18 == 2) {
      (ctx->input).mouse.grab = '\0';
      (ctx->input).mouse.grabbed = '\0';
      (ctx->input).mouse.ungrab = '\x01';
    }
    (pnVar34->property).select_start = 0;
    (pnVar34->property).select_end = 0;
    (pnVar34->property).active = 0;
  }
  return;
}

Assistant:

NK_LIB void
nk_property(struct nk_context *ctx, const char *name, struct nk_property_variant *variant,
float inc_per_pixel, const enum nk_property_filter filter)
{
struct nk_window *win;
struct nk_panel *layout;
struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states s;

int *state = 0;
nk_hash hash = 0;
char *buffer = 0;
int *len = 0;
int *cursor = 0;
int *select_begin = 0;
int *select_end = 0;
int old_state;

char dummy_buffer[NK_MAX_NUMBER_BUFFER];
int dummy_state = NK_PROPERTY_DEFAULT;
int dummy_length = 0;
int dummy_cursor = 0;
int dummy_select_begin = 0;
int dummy_select_end = 0;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
style = &ctx->style;
s = nk_widget(&bounds, ctx);
if (!s) return;

/* calculate hash from name */
if (name[0] == '#') {
hash = nk_murmur_hash(name, (int)nk_strlen(name), win->property.seq++);
name++; /* special number hash */
} else hash = nk_murmur_hash(name, (int)nk_strlen(name), 42);

/* check if property is currently hot item */
if (win->property.active && hash == win->property.name) {
buffer = win->property.buffer;
len = &win->property.length;
cursor = &win->property.cursor;
state = &win->property.state;
select_begin = &win->property.select_start;
select_end = &win->property.select_end;
} else {
buffer = dummy_buffer;
len = &dummy_length;
cursor = &dummy_cursor;
state = &dummy_state;
select_begin =  &dummy_select_begin;
select_end = &dummy_select_end;
}

/* execute property widget */
old_state = *state;
ctx->text_edit.clip = ctx->clip;
in = ((s == NK_WIDGET_ROM && !win->property.active) ||
layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
nk_do_property(&ctx->last_widget_state, &win->buffer, bounds, name,
variant, inc_per_pixel, buffer, len, state, cursor, select_begin,
select_end, &style->property, filter, in, style->font, &ctx->text_edit,
ctx->button_behavior);

if (in && *state != NK_PROPERTY_DEFAULT && !win->property.active) {
/* current property is now hot */
win->property.active = 1;
NK_MEMCPY(win->property.buffer, buffer, (nk_size)*len);
win->property.length = *len;
win->property.cursor = *cursor;
win->property.state = *state;
win->property.name = hash;
win->property.select_start = *select_begin;
win->property.select_end = *select_end;
if (*state == NK_PROPERTY_DRAG) {
ctx->input.mouse.grab = nk_true;
ctx->input.mouse.grabbed = nk_true;
}
}
/* check if previously active property is now inactive */
if (*state == NK_PROPERTY_DEFAULT && old_state != NK_PROPERTY_DEFAULT) {
if (old_state == NK_PROPERTY_DRAG) {
ctx->input.mouse.grab = nk_false;
ctx->input.mouse.grabbed = nk_false;
ctx->input.mouse.ungrab = nk_true;
}
win->property.select_start = 0;
win->property.select_end = 0;
win->property.active = 0;
}
}